

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O1

void __thiscall SRCINFO::SRCINFO(SRCINFO *this,SRCINFO *other)

{
  SourceContextInfo *pSVar1;
  
  pSVar1 = (other->sourceContextInfo).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->sourceContextInfo).ptr = pSVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  this->dlnHost = other->dlnHost;
  this->ulColumnHost = other->ulColumnHost;
  this->lnMinHost = other->lnMinHost;
  this->ichMinHost = other->ichMinHost;
  this->ichLimHost = other->ichLimHost;
  this->ulCharOffset = other->ulCharOffset;
  this->moduleID = other->moduleID;
  this->grfsi = other->grfsi;
  return;
}

Assistant:

SRCINFO(const SRCINFO& other)
        :sourceContextInfo(other.sourceContextInfo),
        dlnHost(other.dlnHost),
        ulColumnHost(other.ulColumnHost),
        lnMinHost(other.lnMinHost),
        ichMinHost(other.ichMinHost),
        ichLimHost(other.ichLimHost),
        ulCharOffset(other.ulCharOffset),
        moduleID(other.moduleID),
        grfsi(other.grfsi)
    {
    }